

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Buffer::remove_samples(Blip_Buffer *this,long count)

{
  long lVar1;
  long in_RSI;
  Blip_Buffer *in_RDI;
  long remain;
  
  if (in_RSI != 0) {
    remove_silence(in_RDI,in_RSI);
    lVar1 = samples_avail(in_RDI);
    memmove(in_RDI->buffer_,in_RDI->buffer_ + in_RSI,(lVar1 + 0x12) * 4);
    memset(in_RDI->buffer_ + lVar1 + 0x12,0,in_RSI << 2);
  }
  return;
}

Assistant:

void Blip_Buffer::remove_samples( long count )
{
	if ( count )
	{
		remove_silence( count );
		
		// copy remaining samples to beginning and clear old samples
		long remain = samples_avail() + blip_buffer_extra_;
		memmove( buffer_, buffer_ + count, remain * sizeof *buffer_ );
		memset( buffer_ + remain, 0, count * sizeof *buffer_ );
	}
}